

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.cc
# Opt level: O2

int OPENSSL_sk_find(OPENSSL_STACK *sk,size_t *out_index,void *p,
                   OPENSSL_sk_call_cmp_func call_cmp_func)

{
  ulong uVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  if (sk != (OPENSSL_STACK *)0x0) {
    if (sk->comp == (OPENSSL_sk_cmp_func)0x0) {
      for (uVar4 = 0; sk->num != uVar4; uVar4 = uVar4 + 1) {
        if (sk->data[uVar4] == p) goto joined_r0x001ae4d3;
      }
    }
    else if (p != (void *)0x0) {
      iVar2 = OPENSSL_sk_is_sorted(sk);
      if (iVar2 == 0) {
        for (uVar4 = 0; uVar4 < sk->num; uVar4 = uVar4 + 1) {
          iVar2 = (*call_cmp_func)(sk->comp,p,sk->data[uVar4]);
          if (iVar2 == 0) goto joined_r0x001ae4d3;
        }
      }
      else {
        uVar5 = 0;
        uVar1 = sk->num;
        while (uVar3 = uVar1, lVar6 = uVar3 - uVar5, uVar5 <= uVar3 && lVar6 != 0) {
          uVar4 = (lVar6 - 1U >> 1) + uVar5;
          if ((uVar4 < uVar5) || (uVar3 <= uVar4)) {
            __assert_fail("lo <= mid && mid < hi",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                          ,0x113,
                          "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                         );
          }
          iVar2 = (*call_cmp_func)(sk->comp,p,sk->data[uVar4]);
          if (iVar2 < 1) {
            uVar1 = uVar4;
            if (-1 < iVar2) {
              if (lVar6 == 1) {
joined_r0x001ae4d3:
                if (out_index != (size_t *)0x0) {
                  *out_index = uVar4;
                }
                return 1;
              }
              uVar1 = uVar4 + 1;
              if (uVar3 <= uVar4 + 1) {
                __assert_fail("mid + 1 < hi",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                              ,0x124,
                              "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                             );
              }
            }
          }
          else {
            uVar5 = uVar4 + 1;
            uVar1 = uVar3;
          }
        }
        if (uVar3 != uVar5) {
          __assert_fail("lo == hi",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/stack/stack.cc"
                        ,0x129,
                        "int OPENSSL_sk_find(const OPENSSL_STACK *, size_t *, const void *, OPENSSL_sk_call_cmp_func)"
                       );
        }
      }
    }
  }
  return 0;
}

Assistant:

int OPENSSL_sk_find(const OPENSSL_STACK *sk, size_t *out_index, const void *p,
                    OPENSSL_sk_call_cmp_func call_cmp_func) {
  if (sk == NULL) {
    return 0;
  }

  if (sk->comp == NULL) {
    // Use pointer equality when no comparison function has been set.
    for (size_t i = 0; i < sk->num; i++) {
      if (sk->data[i] == p) {
        if (out_index) {
          *out_index = i;
        }
        return 1;
      }
    }
    return 0;
  }

  if (p == NULL) {
    return 0;
  }

  if (!OPENSSL_sk_is_sorted(sk)) {
    for (size_t i = 0; i < sk->num; i++) {
      if (call_cmp_func(sk->comp, p, sk->data[i]) == 0) {
        if (out_index) {
          *out_index = i;
        }
        return 1;
      }
    }
    return 0;
  }

  // The stack is sorted, so binary search to find the element.
  //
  // |lo| and |hi| maintain a half-open interval of where the answer may be. All
  // indices such that |lo <= idx < hi| are candidates.
  size_t lo = 0, hi = sk->num;
  while (lo < hi) {
    // Bias |mid| towards |lo|. See the |r == 0| case below.
    size_t mid = lo + (hi - lo - 1) / 2;
    assert(lo <= mid && mid < hi);
    int r = call_cmp_func(sk->comp, p, sk->data[mid]);
    if (r > 0) {
      lo = mid + 1;  // |mid| is too low.
    } else if (r < 0) {
      hi = mid;  // |mid| is too high.
    } else {
      // |mid| matches. However, this function returns the earliest match, so we
      // can only return if the range has size one.
      if (hi - lo == 1) {
        if (out_index != NULL) {
          *out_index = mid;
        }
        return 1;
      }
      // The sample is biased towards |lo|. |mid| can only be |hi - 1| if
      // |hi - lo| was one, so this makes forward progress.
      assert(mid + 1 < hi);
      hi = mid + 1;
    }
  }

  assert(lo == hi);
  return 0;  // Not found.
}